

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O0

void __thiscall antlr::InputBuffer::fill(InputBuffer *this,uint amount)

{
  size_t sVar1;
  int in_ESI;
  long *in_RDI;
  int *in_stack_ffffffffffffffd8;
  InputBuffer *in_stack_ffffffffffffffe0;
  
  syncConsume(in_stack_ffffffffffffffe0);
  while( true ) {
    sVar1 = CircularQueue<int>::entries((CircularQueue<int> *)in_stack_ffffffffffffffe0);
    if ((uint)(in_ESI + *(int *)((long)in_RDI + 0xc)) <= sVar1) break;
    in_stack_ffffffffffffffe0 = (InputBuffer *)(in_RDI + 3);
    (**(code **)(*in_RDI + 0x28))();
    CircularQueue<int>::append
              ((CircularQueue<int> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void InputBuffer::fill(unsigned int amount)
{
	syncConsume();

	// Fill the buffer sufficiently to hold needed characters
	while (queue.entries() < amount + markerOffset)
        {         
            // Append the next character
            queue.append(getChar());            
	}
}